

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::interpreter::impl::scope::scope(scope *this,object_ptr *act,scope_ptr *prev)

{
  gc_heap *pgVar1;
  undefined1 local_50 [32];
  undefined1 local_30 [24];
  scope_ptr *prev_local;
  object_ptr *act_local;
  scope *this_local;
  
  local_30._16_8_ = prev;
  prev_local = (scope_ptr *)act;
  act_local = (object_ptr *)this;
  pgVar1 = gc_heap_ptr_untyped::heap(&act->super_gc_heap_ptr_untyped);
  this->heap_ = pgVar1;
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked
            (&this->activation_,(gc_heap_ptr<mjs::object> *)prev_local);
  gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::gc_heap_ptr_untracked
            (&this->prev_,(gc_heap_ptr<mjs::interpreter::impl::scope> *)local_30._16_8_);
  gc_vector<const_mjs::function_definition_*>::make((gc_heap *)local_30,(uint32_t)this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<const_mjs::function_definition_*>,_true>::
  gc_heap_ptr_untracked
            (&this->active_functions_,
             (gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>_> *)local_30);
  gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>_>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>_> *)local_30);
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::make
            ((gc_heap *)local_50,(uint32_t)this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true>::
  gc_heap_ptr_untracked
            (&this->active_function_values_,
             (gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>_> *)
             local_50);
  gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>_>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>_> *)
             local_50);
  return;
}

Assistant:

explicit scope(const object_ptr& act, const scope_ptr& prev)
            : heap_(act.heap())
            , activation_(act)
            , prev_(prev)
            , active_functions_(gc_vector<const function_definition*>::make(heap_, 4))
            , active_function_values_(gc_vector<weak_object_ptr>::make(heap_, 4)) {
        }